

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O0

bool __thiscall
Diligent::TextureVkImpl::InitializeContentOnHost
          (TextureVkImpl *this,TextureData *InitData,TextureFormatAttribs *FmtAttribs,
          VkImageCreateInfo *ImageCI)

{
  TextureSubResData *pTVar1;
  uint uVar2;
  undefined *puVar3;
  VkImageLayout VVar4;
  RESOURCE_STATE State;
  RenderDeviceVkImpl *this_00;
  ExtensionFeatures *pEVar5;
  Char *pCVar6;
  undefined8 uVar7;
  size_type sVar8;
  VkImageCreateInfo *Args_1;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 local_204;
  uint local_1f4;
  undefined1 auStack_1c8 [8];
  VkCopyMemoryToImageInfoEXT vkCopyInfo;
  VkHostImageLayoutTransitionInfoEXT vkLayoutTransitionInfo;
  undefined1 local_148 [8];
  string _msg_1;
  undefined1 local_120 [8];
  string _msg;
  undefined1 local_f8 [4];
  Uint32 PixelSize;
  MipLevelProperties MipInfo;
  VkMemoryToImageCopyEXT *vkCopyInfo_1;
  TextureSubResData *SubResData;
  Uint32 mip;
  Uint32 layer;
  Uint32 subres;
  vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_> vkCopyRegions;
  undefined1 local_88 [4];
  VkImageAspectFlags aspectMask;
  string msg_1;
  Uint32 ExpectedNumSubresources;
  undefined1 local_58 [8];
  string msg;
  VulkanLogicalDevice *LogicalDevice;
  VkImageCreateInfo *ImageCI_local;
  TextureFormatAttribs *FmtAttribs_local;
  TextureData *InitData_local;
  TextureVkImpl *this_local;
  
  Args_1 = ImageCI;
  this_00 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                         *)this);
  msg.field_2._8_8_ = RenderDeviceVkImpl::GetLogicalDevice(this_00);
  pEVar5 = VulkanUtilities::VulkanLogicalDevice::GetEnabledExtFeatures
                     ((VulkanLogicalDevice *)msg.field_2._8_8_);
  if ((pEVar5->HostImageCopy).hostImageCopy == 0) {
    FormatString<char[26],char[66]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LogicalDevice.GetEnabledExtFeatures().HostImageCopy.hostImageCopy",
               (char (*) [66])Args_1);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"InitializeContentOnHost",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x14b);
    std::__cxx11::string::~string((string *)local_58);
  }
  msg_1.field_2._8_4_ = ImageCI->mipLevels * ImageCI->arrayLayers;
  if (InitData->NumSubresources != msg_1.field_2._8_4_) {
    LogError<true,char[48],unsigned_int,char[18],unsigned_int,char[10]>
              (false,"InitializeContentOnHost",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x14f,(char (*) [48])"Incorrect number of subresources in init data. ",
               (uint *)(msg_1.field_2._M_local_buf + 8),(char (*) [18])" expected, while ",
               &InitData->NumSubresources,(char (*) [10])0xe43ec6);
  }
  if (FmtAttribs->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) {
    FormatString<char[63]>
              ((string *)local_88,
               (char (*) [63])"Initializing depth-stencil texture is currently not supported.");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"InitializeContentOnHost",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x151);
    std::__cxx11::string::~string((string *)local_88);
  }
  vkCopyRegions.super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       ComponentTypeToVkAspectMask(FmtAttribs->ComponentType);
  uVar2 = InitData->NumSubresources;
  std::allocator<VkMemoryToImageCopy>::allocator
            ((allocator<VkMemoryToImageCopy> *)((long)&layer + 3));
  std::vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>::vector
            ((vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_> *)&subres,
             (ulong)uVar2,(allocator<VkMemoryToImageCopy> *)((long)&layer + 3));
  std::allocator<VkMemoryToImageCopy>::~allocator
            ((allocator<VkMemoryToImageCopy> *)((long)&layer + 3));
  mip = 0;
  SubResData._4_4_ = 0;
  do {
    if (ImageCI->arrayLayers <= SubResData._4_4_) {
      vkCopyInfo.pRegions = (VkMemoryToImageCopy *)0x3b9ee8b6;
      VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkImage_T_
                ((VulkanObjectWrapper *)&this->m_VulkanImage);
      VVar4 = anon_unknown_107::VkImageLayoutFromUsage(ImageCI->usage);
      VulkanUtilities::VulkanLogicalDevice::HostTransitionImageLayout
                ((VulkanLogicalDevice *)msg.field_2._8_8_,
                 (VkHostImageLayoutTransitionInfoEXT *)&vkCopyInfo.pRegions);
      vkCopyInfo.dstImage = (VkImage)0x0;
      vkCopyInfo.dstImageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      vkCopyInfo.regionCount = 0;
      vkCopyInfo.flags = 0;
      vkCopyInfo._20_4_ = 0;
      auStack_1c8 = (undefined1  [8])0x3b9ee8b5;
      vkCopyInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      vkCopyInfo._4_4_ = 0;
      vkCopyInfo.pNext = (void *)0x0;
      vkCopyInfo._16_8_ =
           VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkImage_T_
                     ((VulkanObjectWrapper *)&this->m_VulkanImage);
      vkCopyInfo.dstImage = (VkImage)CONCAT44(vkCopyInfo.dstImage._4_4_,VVar4);
      sVar8 = std::vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>::size
                        ((vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_> *)
                         &subres);
      vkCopyInfo.dstImage = (VkImage)CONCAT44((int)sVar8,(VkImageLayout)vkCopyInfo.dstImage);
      vkCopyInfo._32_8_ =
           std::vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>::data
                     ((vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_> *)&subres);
      VulkanUtilities::VulkanLogicalDevice::CopyMemoryToImage
                ((VulkanLogicalDevice *)msg.field_2._8_8_,(VkCopyMemoryToImageInfoEXT *)auStack_1c8)
      ;
      State = VkImageLayoutToResourceState((VkImageLayout)vkCopyInfo.dstImage);
      TextureBase<Diligent::EngineVkImplTraits>::SetState
                (&this->super_TextureBase<Diligent::EngineVkImplTraits>,State);
      this_local._7_1_ = true;
LAB_00335ba2:
      _msg_1.field_2._12_4_ = 1;
      std::vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>::~vector
                ((vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_> *)&subres);
      return this_local._7_1_;
    }
    for (SubResData._0_4_ = 0; (uint)SubResData < ImageCI->mipLevels;
        SubResData._0_4_ = (uint)SubResData + 1) {
      pTVar1 = InitData->pSubResources + mip;
      MipInfo.MipSize =
           (Uint64)std::vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>::
                   operator[]((vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_> *)
                              &subres,(ulong)mip);
      GetMipLevelProperties
                ((MipLevelProperties *)local_f8,
                 &(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                  .m_Desc,(uint)SubResData);
      *(undefined4 *)MipInfo.MipSize = 0x3b9ee8b2;
      *(undefined8 *)(MipInfo.MipSize + 8) = 0;
      *(void **)(MipInfo.MipSize + 0x10) = pTVar1->pData;
      if (FmtAttribs->ComponentType == COMPONENT_TYPE_COMPRESSED) {
        local_1f4 = (uint)FmtAttribs->ComponentSize;
      }
      else {
        local_1f4 = (uint)FmtAttribs->ComponentSize * (uint)FmtAttribs->NumComponents;
      }
      _msg.field_2._12_4_ = local_1f4;
      if (pTVar1->Stride % (ulong)local_1f4 != 0) {
        FormatString<char[31],char_const*,char[24],unsigned_int,char[13],unsigned_long,char[37],unsigned_int,char[45]>
                  ((string *)local_120,(Diligent *)"Unable to initialize texture \'",
                   (char (*) [31])
                   &(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                    .m_Desc,(char **)"\' on host: subresource ",(char (*) [24])&mip,
                   (uint *)" has stride ",(char (*) [13])&pTVar1->Stride,
                   (unsigned_long *)" that is not multiple of pixel size ",
                   (char (*) [37])((long)&_msg.field_2 + 0xc),
                   (uint *)". The content will be initialized on device.",
                   (char (*) [45])CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        puVar3 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar7 = std::__cxx11::string::c_str();
          (*(code *)puVar3)(1,uVar7,0);
        }
        std::__cxx11::string::~string((string *)local_120);
        this_local._7_1_ = false;
        goto LAB_00335ba2;
      }
      if (FmtAttribs->ComponentType == COMPONENT_TYPE_COMPRESSED) {
        local_204 = (undefined4)
                    ((pTVar1->Stride * (ulong)FmtAttribs->BlockWidth) /
                    (ulong)FmtAttribs->ComponentSize);
      }
      else {
        local_204 = (undefined4)(pTVar1->Stride / (ulong)local_1f4);
      }
      *(undefined4 *)(MipInfo.MipSize + 0x18) = local_204;
      if (pTVar1->DepthStride % pTVar1->Stride != 0) {
        FormatString<char[31],char_const*,char[24],unsigned_int,char[19],unsigned_long,char[37],unsigned_long,char[45]>
                  ((string *)local_148,(Diligent *)"Unable to initialize texture \'",
                   (char (*) [31])
                   &(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                    .m_Desc,(char **)"\' on host: subresource ",(char (*) [24])&mip,
                   (uint *)" has depth stride ",(char (*) [19])&pTVar1->DepthStride,
                   (unsigned_long *)" that is not multiple of row stride ",
                   (char (*) [37])&pTVar1->Stride,
                   (unsigned_long *)". The content will be initialized on device.",
                   (char (*) [45])CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        puVar3 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar7 = std::__cxx11::string::c_str();
          (*(code *)puVar3)(1,uVar7,0);
        }
        std::__cxx11::string::~string((string *)local_148);
        this_local._7_1_ = false;
        goto LAB_00335ba2;
      }
      *(int *)(MipInfo.MipSize + 0x1c) =
           (int)((pTVar1->DepthStride * (ulong)FmtAttribs->BlockHeight) / pTVar1->Stride);
      *(VkImageAspectFlags *)(MipInfo.MipSize + 0x20) =
           vkCopyRegions.
           super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
      *(uint *)(MipInfo.MipSize + 0x24) = (uint)SubResData;
      *(uint *)(MipInfo.MipSize + 0x28) = SubResData._4_4_;
      *(undefined4 *)(MipInfo.MipSize + 0x2c) = 1;
      *(undefined8 *)(MipInfo.MipSize + 0x30) = 0;
      *(undefined4 *)(MipInfo.MipSize + 0x38) = 0;
      *(ulong *)(MipInfo.MipSize + 0x3c) = CONCAT44(PixelSize,local_f8);
      *(Uint32 *)(MipInfo.MipSize + 0x44) = MipInfo.StorageWidth;
      mip = mip + 1;
    }
    SubResData._4_4_ = SubResData._4_4_ + 1;
  } while( true );
}

Assistant:

bool TextureVkImpl::InitializeContentOnHost(const TextureData&          InitData,
                                            const TextureFormatAttribs& FmtAttribs,
                                            const VkImageCreateInfo&    ImageCI) noexcept(false)
{
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = GetDevice()->GetLogicalDevice();
    VERIFY_EXPR(LogicalDevice.GetEnabledExtFeatures().HostImageCopy.hostImageCopy);

    Uint32 ExpectedNumSubresources = ImageCI.mipLevels * ImageCI.arrayLayers;
    if (InitData.NumSubresources != ExpectedNumSubresources)
        LOG_ERROR_AND_THROW("Incorrect number of subresources in init data. ", ExpectedNumSubresources, " expected, while ", InitData.NumSubresources, " provided");

    VERIFY(FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH_STENCIL, "Initializing depth-stencil texture is currently not supported.");
    const VkImageAspectFlags aspectMask = ComponentTypeToVkAspectMask(FmtAttribs.ComponentType);

    std::vector<VkMemoryToImageCopyEXT> vkCopyRegions(InitData.NumSubresources);

    Uint32 subres = 0;
    for (Uint32 layer = 0; layer < ImageCI.arrayLayers; ++layer)
    {
        for (Uint32 mip = 0; mip < ImageCI.mipLevels; ++mip)
        {
            const TextureSubResData& SubResData = InitData.pSubResources[subres];
            VkMemoryToImageCopyEXT&  vkCopyInfo = vkCopyRegions[subres];
            MipLevelProperties       MipInfo    = GetMipLevelProperties(m_Desc, mip);

            vkCopyInfo.sType        = VK_STRUCTURE_TYPE_MEMORY_TO_IMAGE_COPY_EXT;
            vkCopyInfo.pNext        = nullptr;
            vkCopyInfo.pHostPointer = SubResData.pData;

            const Uint32 PixelSize = FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED ?
                Uint32{FmtAttribs.ComponentSize} :
                Uint32{FmtAttribs.ComponentSize} * Uint32{FmtAttribs.NumComponents};
            if ((SubResData.Stride % PixelSize) != 0)
            {
                LOG_DVP_WARNING_MESSAGE("Unable to initialize texture '", m_Desc.Name, "' on host: subresource ", subres, " has stride ", SubResData.Stride,
                                        " that is not multiple of pixel size ", PixelSize, ". The content will be initialized on device.");
                return false;
            }
            vkCopyInfo.memoryRowLength = FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED ?
                static_cast<uint32_t>(SubResData.Stride * FmtAttribs.BlockWidth / FmtAttribs.ComponentSize) :
                static_cast<uint32_t>(SubResData.Stride / PixelSize);

            if ((SubResData.DepthStride % SubResData.Stride) != 0)
            {
                LOG_DVP_WARNING_MESSAGE("Unable to initialize texture '", m_Desc.Name, "' on host: subresource ", subres, " has depth stride ", SubResData.DepthStride,
                                        " that is not multiple of row stride ", SubResData.Stride, ". The content will be initialized on device.");
                return false;
            }
            vkCopyInfo.memoryImageHeight = static_cast<uint32_t>(SubResData.DepthStride * FmtAttribs.BlockHeight / SubResData.Stride);

            vkCopyInfo.imageSubresource.aspectMask     = aspectMask;
            vkCopyInfo.imageSubresource.mipLevel       = mip;
            vkCopyInfo.imageSubresource.baseArrayLayer = layer;
            vkCopyInfo.imageSubresource.layerCount     = 1;

            vkCopyInfo.imageOffset = {0, 0, 0};
            vkCopyInfo.imageExtent = {MipInfo.LogicalWidth, MipInfo.LogicalHeight, MipInfo.Depth};

            ++subres;
        }
    }

    VkHostImageLayoutTransitionInfoEXT vkLayoutTransitionInfo{};
    vkLayoutTransitionInfo.sType     = VK_STRUCTURE_TYPE_HOST_IMAGE_LAYOUT_TRANSITION_INFO_EXT;
    vkLayoutTransitionInfo.image     = m_VulkanImage;
    vkLayoutTransitionInfo.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    vkLayoutTransitionInfo.newLayout = VkImageLayoutFromUsage(ImageCI.usage);

    vkLayoutTransitionInfo.subresourceRange.aspectMask     = aspectMask;
    vkLayoutTransitionInfo.subresourceRange.baseArrayLayer = 0;
    vkLayoutTransitionInfo.subresourceRange.layerCount     = VK_REMAINING_ARRAY_LAYERS;
    vkLayoutTransitionInfo.subresourceRange.baseMipLevel   = 0;
    vkLayoutTransitionInfo.subresourceRange.levelCount     = VK_REMAINING_MIP_LEVELS;
    LogicalDevice.HostTransitionImageLayout(vkLayoutTransitionInfo);

    VkCopyMemoryToImageInfoEXT vkCopyInfo{};
    vkCopyInfo.sType          = VK_STRUCTURE_TYPE_COPY_MEMORY_TO_IMAGE_INFO_EXT;
    vkCopyInfo.pNext          = nullptr;
    vkCopyInfo.flags          = 0;
    vkCopyInfo.dstImage       = m_VulkanImage;
    vkCopyInfo.dstImageLayout = vkLayoutTransitionInfo.newLayout;
    vkCopyInfo.regionCount    = static_cast<uint32_t>(vkCopyRegions.size());
    vkCopyInfo.pRegions       = vkCopyRegions.data();

    LogicalDevice.CopyMemoryToImage(vkCopyInfo);

    SetState(VkImageLayoutToResourceState(vkCopyInfo.dstImageLayout));

    return true;
}